

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O1

bool __thiscall Alignment::StaticAlignmentMean(Alignment *this)

{
  Vector3d *m;
  undefined8 *puVar1;
  double *dst;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  Index row;
  ostream *poVar10;
  uint uVar11;
  Index row_2;
  ulong uVar12;
  long lVar13;
  Index row_5;
  ulong uVar14;
  int iVar15;
  Matrix3d *pMVar16;
  Alignment *this_00;
  ActualDstType actualDst_2;
  type lhs;
  byte bVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Matrix3d observation;
  Matrix3d reference;
  DstEvaluatorType dstEvaluator;
  Matrix3d Cnb;
  SrcEvaluatorType srcEvaluator_1;
  assign_op<double,_double> local_2a1;
  double local_2a0;
  undefined8 local_298;
  double local_290;
  SrcXprType local_288;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> local_280;
  undefined1 local_278 [16];
  double local_268;
  double local_258;
  double dStack_250;
  double local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  double local_218 [9];
  undefined1 local_1d0 [8];
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double dStack_198;
  double dStack_190;
  undefined1 local_188 [16];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_178;
  double local_150;
  plainobjectbase_evaluator_data<double,_3> local_140;
  DstXprType local_138;
  SrcEvaluatorType local_f0;
  double local_88;
  
  bVar17 = 0;
  CalculateMean(this);
  m = this->Mean;
  poVar10 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)m);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  local_238 = 0;
  uStack_230 = 0;
  local_228 = 0xc0239655051512b7;
  dVar3 = Deg2Rad(30.5278);
  dVar3 = cos(dVar3);
  local_188._8_4_ = extraout_XMM0_Dc;
  local_188._0_8_ = dVar3;
  local_188._12_4_ = extraout_XMM0_Dd;
  dVar3 = Deg2Rad(30.5278);
  local_290 = sin(dVar3);
  local_298 = 0;
  local_290 = local_290 * -7.292115e-05;
  local_1b8 = (double)local_188._0_8_ * 7.292115e-05;
  local_2a0 = local_1b8;
  dStack_250 = local_1b8 * -9.7936174 + local_290 * -0.0;
  local_248 = local_1b8 * -0.0 + 0.0;
  local_258 = local_290 * 0.0 + 0.0;
  dVar3 = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0];
  dVar2 = this->Mean[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0];
  dVar6 = this->Mean[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1];
  dVar5 = this->Mean[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2];
  dVar7 = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1];
  dVar8 = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2];
  dVar4 = dVar8 * dVar6 - dVar5 * dVar7;
  dVar5 = dVar3 * dVar5 - dVar2 * dVar8;
  local_268 = dVar2 * dVar7 - dVar6 * dVar3;
  local_278._8_4_ = SUB84(dVar5,0);
  local_278._0_8_ = dVar4;
  local_278._12_4_ = (int)((ulong)dVar5 >> 0x20);
  uStack_1c8 = uStack_230;
  uStack_1c0 = local_228;
  uStack_1b0 = 0;
  local_288.m_xpr.m_matrix = (XprTypeNested)local_1d0;
  dStack_198 = dStack_250;
  dStack_190 = local_248;
  uVar12 = (ulong)local_218 >> 3;
  uVar11 = (uint)uVar12 & 1;
  if ((uVar12 & 1) != 0) {
    local_218[0] = dVar2;
  }
  uVar14 = (ulong)(uVar11 * 8);
  puVar1 = (undefined8 *)
           ((long)(m->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                  .array + uVar14);
  uVar9 = puVar1[1];
  *(undefined8 *)((long)local_218 + uVar14) = *puVar1;
  *(undefined8 *)((long)local_218 + uVar14 + 8) = uVar9;
  if ((uVar12 & 1) == 0) {
    uVar12 = (ulong)((uVar11 | 2) << 3);
    *(undefined8 *)((long)local_218 + uVar12) =
         *(undefined8 *)
          ((long)(m->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array + uVar12);
  }
  uVar11 = (int)local_218 + 0x18U >> 3 & 1;
  if (uVar11 != 0) {
    local_218[3] = dVar3;
  }
  uVar12 = (ulong)(uVar11 * 8);
  puVar1 = (undefined8 *)
           ((long)this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + uVar12);
  uVar9 = puVar1[1];
  *(undefined8 *)((long)local_218 + uVar12 + 0x18) = *puVar1;
  *(undefined8 *)((long)local_218 + uVar12 + 0x20) = uVar9;
  if (uVar11 == 0) {
    local_218[5] = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2];
  }
  local_280.m_d.data = (plainobjectbase_evaluator_data<double,_3>)local_218;
  uVar11 = SUB84(local_280.m_d.data,0) + 0x30U >> 3 & 1;
  if (uVar11 != 0) {
    local_218[6] = dVar4;
  }
  uVar12 = (ulong)(uVar11 * 8);
  uVar9 = *(undefined8 *)(local_278 + uVar12 + 8);
  *(undefined8 *)((long)local_218 + uVar12 + 0x30) = *(undefined8 *)(local_278 + uVar12);
  *(undefined8 *)((long)local_218 + uVar12 + 0x38) = uVar9;
  if (uVar11 == 0) {
    local_218[8] = local_268;
  }
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)&local_f0,&local_288,
        (assign_op<double,_double> *)&local_178);
  local_f0.
  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs.m_matrix = (non_const_type)local_280.m_d.data;
  local_f0.
  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.
  super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
  data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
          )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )local_280.m_d.data;
  local_f0.
  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 3;
  local_178.m_dstExpr = &local_138;
  local_178.m_dst = (DstEvaluatorType *)&local_140;
  local_178.m_functor = &local_2a1;
  local_178.m_src = &local_f0;
  local_140.data = (double *)local_178.m_dstExpr;
  local_f0.
  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)&local_f0;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_178);
  pMVar16 = &this->Cbn;
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
  iVar15 = 0x1e;
  dst = local_f0.
        super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        4;
  do {
    local_150 = 0.5;
    local_178.m_src = (SrcEvaluatorType *)pMVar16;
    local_178.m_functor = (assign_op<double,_double> *)pMVar16;
    local_f0.
    super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)pMVar16;
    local_f0.
    super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)dst;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_3,_3,_1,_3,_3> *)dst,(SrcXprType *)&local_178.m_functor,
          (assign_op<double,_double> *)&local_288);
    local_88 = local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[0] +
          *(double *)
           local_f0.
           super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
           .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[3]) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[1] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x18)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[2] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x30)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [3] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[3] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 8)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [4] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[4] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x20)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [5] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[5] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x38)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [6] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[6] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x10)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [7] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[7] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x28)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[8] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x40)) * local_150;
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  this_00 = (Alignment *)&stack0xffffffffffffff88;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    this_00->OriginData[0].
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(pMVar16->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0];
    pMVar16 = (Matrix3d *)((long)pMVar16 + (ulong)bVar17 * -0x10 + 8);
    this_00 = (Alignment *)((long)this_00 + (ulong)bVar17 * -0x10 + 8);
  }
  CalculateEuler(this_00,(Matrix3d *)&stack0xffffffffffffff88,this->Euler_mean);
  return true;
}

Assistant:

bool Alignment::StaticAlignmentMean()
{
    this->CalculateMean();
    cout << this->Mean[0] << endl;
    Vector3d gn(0, 0, -GRAVITY);
    Vector3d Omega_n(OMEGA * cos(Deg2Rad(PHI)), 0, -OMEGA * sin(Deg2Rad(PHI)));
    Vector3d vn = gn.cross(Omega_n);
    Vector3d vb = this->Mean[0].cross(this->Mean[1]);

    Matrix3d reference;
    reference.block(0, 0, 3, 1) = gn;
    reference.block(0, 1, 3, 1) = Omega_n;
    reference.block(0, 2, 3, 1) = vn;
    
    Matrix3d observation;
    observation.block(0, 0, 3, 1) = this->Mean[0];
    observation.block(0, 1, 3, 1) = this->Mean[1];
    observation.block(0, 2, 3, 1) = vb;
    try
    {
        Matrix3d Cnb = reference.transpose().inverse() * observation.transpose();
        this->Cbn = Cnb;
        for(int i = 0; i < 30; ++i)
        {
            auto temp = (this->Cbn + (Cbn.transpose()).inverse()) * 0.5;
            this->Cbn = temp;
        }

        this->CalculateEuler(Cbn, this->Euler_mean);
    }
    catch(const std::exception& e)
    {
        std::cout << e.what() << '\n';
        return false;
    }

    return true;
}